

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

void __thiscall
helics::apps::Recorder::Recorder(Recorder *this,string_view appName,string *jsonString)

{
  undefined8 *in_RDI;
  string *in_stack_00000148;
  App *in_stack_00000150;
  undefined1 in_stack_00000158 [16];
  unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
  *in_stack_ffffffffffffff40;
  Recorder *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Recorder *this_02;
  
  App::App(in_stack_00000150,(string_view)in_stack_00000158,in_stack_00000148);
  *in_RDI = &PTR__Recorder_00a47140;
  *(undefined1 *)(in_RDI + 0x14) = 0;
  *(undefined1 *)((long)in_RDI + 0xa1) = 0;
  in_RDI[0x15] = 0;
  std::unique_ptr<helics::CloningFilter,std::default_delete<helics::CloningFilter>>::
  unique_ptr<std::default_delete<helics::CloningFilter>,void>(in_stack_ffffffffffffff40);
  CLI::std::
  vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
  ::vector((vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
            *)0x3f1224);
  this_02 = (Recorder *)(in_RDI + 0x1a);
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::deque
            ((deque<helics::Input,_std::allocator<helics::Input>_> *)0x3f123a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3f1252);
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::deque
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x3f1268);
  this_00 = (Recorder *)(in_RDI + 0x31);
  std::unique_ptr<helics::Endpoint,std::default_delete<helics::Endpoint>>::
  unique_ptr<std::default_delete<helics::Endpoint>,void>
            ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)this_00);
  std::
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::vector((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
            *)0x3f1296);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x35);
  CLI::std::
  map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::map((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
         *)0x3f12ac);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x3f12c2);
  CLI::std::
  map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::map((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
         *)0x3f12d8);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x3f12ee);
  CLI::std::
  vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>::
  vector((vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
          *)0x3f1304);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3f131a);
  std::__cxx11::string::string(this_01);
  processArgs(this_02);
  initialSetup(this_00);
  return;
}

Assistant:

Recorder::Recorder(std::string_view appName, const std::string& jsonString):
    App(appName, jsonString)
{
    processArgs();
    initialSetup();
}